

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

float rr::anon_unknown_19::findPrimitiveMinimumResolvableDifference
                (Triangle *triangle,MultisampleConstPixelBufferAccess *depthAccess)

{
  float *pfVar1;
  ConstPixelBufferAccess *this;
  TextureFormat *pTVar2;
  int *piVar3;
  float fVar4;
  Vector<int,_4> local_4c;
  int local_3c;
  TextureChannelClass local_38;
  int numBits;
  TextureChannelClass channelClass;
  ChannelType channelType;
  ChannelOrder order;
  TextureFormat format;
  float maxZvalue;
  MultisampleConstPixelBufferAccess *depthAccess_local;
  Triangle *triangle_local;
  
  unique0x1000015f = depthAccess;
  pfVar1 = tcu::Vector<float,_4>::z(&triangle->v0->position);
  fVar4 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::z(&triangle->v1->position);
  fVar4 = de::max<float>(fVar4,*pfVar1);
  pfVar1 = tcu::Vector<float,_4>::z(&triangle->v2->position);
  format.order = (ChannelOrder)de::max<float>(fVar4,*pfVar1);
  this = MultisampleConstPixelBufferAccess::raw(stack0xffffffffffffffe0);
  pTVar2 = tcu::ConstPixelBufferAccess::getFormat(this);
  _channelType = *pTVar2;
  channelClass = channelType;
  if (channelType == UNSIGNED_SHORT_4444) {
    numBits = order;
    local_38 = tcu::getTextureChannelClass(order);
    tcu::getTextureFormatBitDepth((tcu *)&local_4c,(TextureFormat *)&channelType);
    piVar3 = tcu::Vector<int,_4>::x(&local_4c);
    local_3c = *piVar3;
    if (local_38 == TEXTURECHANNELCLASS_FLOATING_POINT) {
      fVar4 = getFloatingPointMinimumResolvableDifference((float)format.order,numBits);
      return fVar4;
    }
    fVar4 = getFixedPointMinimumResolvableDifference(local_3c);
    return fVar4;
  }
  if (channelType == SIGNED_INT_1010102_REV) {
    if (order == 0x25) {
      fVar4 = getFloatingPointMinimumResolvableDifference((float)format.order,FLOAT);
      return fVar4;
    }
    if (order == (sBGR|ARGB)) {
      fVar4 = getFixedPointMinimumResolvableDifference(0x18);
      return fVar4;
    }
  }
  return 0.0;
}

Assistant:

static float findPrimitiveMinimumResolvableDifference (const pa::Triangle& triangle, const rr::MultisampleConstPixelBufferAccess& depthAccess)
{
	const float								maxZvalue		= de::max(de::max(triangle.v0->position.z(), triangle.v1->position.z()), triangle.v2->position.z());
	const tcu::TextureFormat				format			= depthAccess.raw().getFormat();
	const tcu::TextureFormat::ChannelOrder	order			= format.order;

	if (order == tcu::TextureFormat::D)
	{
		// depth only
		const tcu::TextureFormat::ChannelType	channelType		= format.type;
		const tcu::TextureChannelClass			channelClass	= tcu::getTextureChannelClass(channelType);
		const int								numBits			= tcu::getTextureFormatBitDepth(format).x();

		if (channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT)
			return getFloatingPointMinimumResolvableDifference(maxZvalue, channelType);
		else
			// \note channelClass might be CLASS_LAST but that's ok
			return getFixedPointMinimumResolvableDifference(numBits);
	}
	else if (order == tcu::TextureFormat::DS)
	{
		// depth stencil, special cases for possible combined formats
		if (format.type == tcu::TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV)
			return getFloatingPointMinimumResolvableDifference(maxZvalue, tcu::TextureFormat::FLOAT);
		else if (format.type == tcu::TextureFormat::UNSIGNED_INT_24_8)
			return getFixedPointMinimumResolvableDifference(24);
	}

	// unexpected format
	DE_ASSERT(false);
	return 0.0f;
}